

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfect_hash_join_executor.cpp
# Opt level: O0

void __thiscall
duckdb::PerfectHashJoinState::PerfectHashJoinState
          (PerfectHashJoinState *this,ClientContext *context,PhysicalHashJoin *join)

{
  bool bVar1;
  Allocator *this_00;
  Expression *in_RDI;
  JoinCondition *cond;
  const_iterator __end2;
  const_iterator __begin2;
  vector<duckdb::JoinCondition,_true> *__range2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *in_stack_ffffffffffffff68;
  type in_stack_ffffffffffffff70;
  ExpressionType *count;
  ClientContext *in_stack_ffffffffffffff98;
  ExpressionExecutor *this_01;
  idx_t in_stack_ffffffffffffffb8;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffffc0;
  __normal_iterator<const_duckdb::JoinCondition_*,_std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>_>
  in_stack_ffffffffffffffc8;
  DataChunk *in_stack_ffffffffffffffd0;
  
  OperatorState::OperatorState((OperatorState *)in_RDI);
  (in_RDI->super_BaseExpression)._vptr_BaseExpression =
       (_func_int **)&PTR__PerfectHashJoinState_0352dfd0;
  this_01 = (ExpressionExecutor *)&(in_RDI->super_BaseExpression).type;
  DataChunk::DataChunk((DataChunk *)in_stack_ffffffffffffff70);
  ExpressionExecutor::ExpressionExecutor
            ((ExpressionExecutor *)
             &(in_RDI->return_type).type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             in_stack_ffffffffffffff98);
  SelectionVector::SelectionVector((SelectionVector *)0x1849667);
  SelectionVector::SelectionVector((SelectionVector *)0x184967f);
  SelectionVector::SelectionVector((SelectionVector *)0x1849697);
  count = &(in_RDI->super_BaseExpression).type;
  this_00 = Allocator::Get((ClientContext *)0x18496b4);
  DataChunk::Initialize
            (in_stack_ffffffffffffffd0,(Allocator *)in_stack_ffffffffffffffc8._M_current,
             in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::begin
            ((vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_> *)
             in_stack_ffffffffffffff68);
  ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::end
            ((vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_> *)
             in_stack_ffffffffffffff68);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_duckdb::JoinCondition_*,_std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>_>
                        *)in_stack_ffffffffffffff70,
                       (__normal_iterator<const_duckdb::JoinCondition_*,_std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>_>
                        *)in_stack_ffffffffffffff68);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_duckdb::JoinCondition_*,_std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>_>
    ::operator*((__normal_iterator<const_duckdb::JoinCondition_*,_std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>_>
                 *)&stack0xffffffffffffffc8);
    in_stack_ffffffffffffff68 =
         &(in_RDI->return_type).type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    in_stack_ffffffffffffff70 =
         unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                   ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *
                    )in_stack_ffffffffffffff70);
    ExpressionExecutor::AddExpression(this_01,in_RDI);
    __gnu_cxx::
    __normal_iterator<const_duckdb::JoinCondition_*,_std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>_>
    ::operator++((__normal_iterator<const_duckdb::JoinCondition_*,_std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>_>
                  *)&stack0xffffffffffffffc8);
  }
  SelectionVector::Initialize((SelectionVector *)this_00,(idx_t)count);
  SelectionVector::Initialize((SelectionVector *)this_00,(idx_t)count);
  SelectionVector::Initialize((SelectionVector *)this_00,(idx_t)count);
  return;
}

Assistant:

PerfectHashJoinState(ClientContext &context, const PhysicalHashJoin &join) : probe_executor(context) {
		join_keys.Initialize(Allocator::Get(context), join.condition_types);
		for (auto &cond : join.conditions) {
			probe_executor.AddExpression(*cond.left);
		}
		build_sel_vec.Initialize(STANDARD_VECTOR_SIZE);
		probe_sel_vec.Initialize(STANDARD_VECTOR_SIZE);
		seq_sel_vec.Initialize(STANDARD_VECTOR_SIZE);
	}